

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_randomspawner.cpp
# Opt level: O3

void __thiscall ARandomSpawner::Tick(ARandomSpawner *this)

{
  AActor *pAVar1;
  
  AActor::Tick(&this->super_AActor);
  pAVar1 = (this->super_AActor).tracer.field_0.p;
  if (pAVar1 != (AActor *)0x0) {
    if (((pAVar1->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      if (0 < pAVar1->health) {
        return;
      }
    }
    else {
      (this->super_AActor).tracer.field_0.p = (AActor *)0x0;
    }
  }
  A_BossDeath(&this->super_AActor);
  (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(this);
  return;
}

Assistant:

void Tick()	// This function is needed for handling boss replacers
	{
		Super::Tick();
		if (tracer == NULL || tracer->health <= 0)
		{
			A_BossDeath(this);
			Destroy();
		}
	}